

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall QPDFWriter::writeLinearized(QPDFWriter *this)

{
  pointer *this_00;
  pointer *this_01;
  pointer *this_02;
  pointer *this_03;
  long lVar1;
  QPDF *pQVar2;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pvVar3;
  __single_object _Var4;
  int iVar5;
  byte bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int last;
  int iVar10;
  int iVar11;
  element_type *peVar12;
  size_type sVar13;
  size_type sVar14;
  size_type sVar15;
  reference this_04;
  QPDFObjGen og;
  reference pvVar16;
  runtime_error *prVar17;
  ulong uVar18;
  char *filename;
  Pl_StdioFile *this_05;
  type pPVar19;
  const_reference pvVar20;
  Object *pOVar21;
  NewObject *pNVar22;
  qpdf_offset_t qVar23;
  qpdf_offset_t qVar24;
  size_t sVar25;
  logic_error *plVar26;
  undefined8 uVar27;
  string_view sVar28;
  string local_7a0;
  string local_780;
  string local_760;
  string local_740;
  QPDFXRefEntry local_720;
  unsigned_long local_708;
  undefined1 local_700 [8];
  PipelinePopper pp_hint;
  qpdf_offset_t hint_offset1;
  string local_6d8;
  string_view local_6b8;
  string_view local_6a8;
  string_view local_698;
  long local_688;
  string_view local_680;
  qpdf_offset_t local_670;
  qpdf_offset_t endpos_1;
  char *local_660;
  QPDFXRefEntry local_658;
  QPDFObjectHandle local_640;
  reference local_630;
  QPDFObjectHandle *cur_object;
  iterator __end2_2;
  iterator __begin2_2;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range2_2;
  string_view local_600;
  undefined1 local_5e9;
  string local_5e8;
  string local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  long local_548;
  qpdf_offset_t local_540;
  qpdf_offset_t endpos;
  qpdf_offset_t hint_offset;
  qpdf_offset_t first_xref_offset;
  char *local_520;
  string_view local_518;
  long local_508;
  string_view local_500;
  string local_4f0;
  string_view local_4d0;
  string_view local_4c0;
  string local_4b0;
  string_view local_490;
  string_view local_480;
  string local_470;
  string_view local_450;
  string_view local_440;
  string local_430;
  string_view local_410;
  string_view local_400;
  string local_3f0;
  string_view local_3d0;
  string_view local_3c0;
  string local_3b0;
  string_view local_390;
  string_view local_380;
  string local_370;
  string_view local_350;
  string_view local_340;
  size_type local_330;
  int local_324;
  undefined1 local_320 [4];
  int npages;
  int local_30c;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pvStack_308;
  int first_page_object;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pages;
  qpdf_offset_t local_2f0;
  qpdf_offset_t pos;
  unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_2e0;
  int local_2d4;
  const_iterator piStack_2d0;
  int pass;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<int> local_2b8;
  initializer_list<int> *local_2a8;
  initializer_list<int> *__range1;
  unique_ptr<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_> local_298
  ;
  __single_object pp_md5;
  unique_ptr<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_> local_288
  ;
  __single_object pp_pass1;
  FILE *lin_pass1_file;
  string hint_buffer;
  qpdf_offset_t hint_length;
  qpdf_offset_t second_xref_end;
  qpdf_offset_t first_xref_end;
  qpdf_offset_t second_xref_offset;
  qpdf_offset_t first_half_max_obj_offset;
  qpdf_offset_t part6_end_offset;
  qpdf_offset_t file_size;
  qpdf_offset_t space_before_zero;
  int part6_end_marker;
  int part4_end_marker;
  int first_trailer_size;
  int first_half_end;
  QPDFObjectHandle *oh_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range2_1;
  pointer *ppQStack_1d8;
  int i_1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *vecs1 [2];
  size_type sStack_1c0;
  int after_part6;
  int local_1b4;
  int local_1b0;
  int part6_first_obj;
  int hint_id;
  int after_part4;
  int local_1a0;
  int local_19c;
  int part4_first_obj;
  int first_half_xref;
  int lindict_id;
  int first_half_start;
  int second_trailer_size;
  int second_half_end;
  reference local_180;
  QPDFObjectHandle *oh;
  iterator __end2;
  iterator __begin2;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range2;
  pointer *ppQStack_158;
  int i;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *vecs2 [3];
  int local_134;
  bool need_xref_stream;
  int second_half_xref;
  int after_second_half;
  int second_half_first_obj;
  int local_11c;
  undefined1 local_118 [4];
  int second_half_uncompressed;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> part9;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> part8;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> part7;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> part6;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> part4;
  function<int_(QPDFObjectHandle_&)> local_90;
  undefined1 local_70 [8];
  anon_class_16_2_9660e4be skip_stream_parameters;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> stream_cache;
  QPDFWriter *this_local;
  
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &skip_stream_parameters.stream_cache);
  local_70 = (undefined1  [8])this;
  skip_stream_parameters.this = (QPDFWriter *)&skip_stream_parameters.stream_cache;
  peVar12 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  pQVar2 = peVar12->pdf;
  peVar12 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  std::function<int(QPDFObjectHandle&)>::function<QPDFWriter::writeLinearized()::__0&,void>
            ((function<int(QPDFObjectHandle&)> *)&local_90,(anon_class_16_2_9660e4be *)local_70);
  QPDF::Writer::optimize(pQVar2,&peVar12->obj,&local_90);
  std::function<int_(QPDFObjectHandle_&)>::~function(&local_90);
  this_00 = &part6.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)this_00);
  this_01 = &part7.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)this_01);
  this_02 = &part8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)this_02);
  this_03 = &part9.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)this_03);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_118);
  peVar12 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  pQVar2 = peVar12->pdf;
  peVar12 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  QPDF::Writer::getLinearizedParts
            (pQVar2,&peVar12->obj,
             (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)this_00,
             (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)this_01,
             (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)this_02,
             (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)this_03,
             (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_118);
  sVar13 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                      &part8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar14 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                      &part9.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar15 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_118);
  _after_second_half = sVar13 + sVar14 + sVar15;
  local_11c = QIntC::to_int<unsigned_long>((unsigned_long *)&after_second_half);
  iVar8 = local_11c + 1;
  peVar12 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  peVar12->next_objid = iVar8;
  local_134 = 0;
  peVar12 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  bVar6 = ((peVar12->obj).streams_empty ^ 0xffU) & 1;
  if (bVar6 != 0) {
    peVar12 = std::
              __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    local_134 = peVar12->next_objid;
    peVar12->next_objid = local_134 + 1;
  }
  ppQStack_158 = &part8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
  vecs2[0] = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
             &part9.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  vecs2[1] = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_118;
  for (__range2._4_4_ = 0; __range2._4_4_ < 3; __range2._4_4_ = __range2._4_4_ + 1) {
    pvVar3 = *(vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> **)
              ((long)&stack0xfffffffffffffea8 + (long)__range2._4_4_ * 8);
    __end2 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin(pvVar3);
    oh = (QPDFObjectHandle *)
         std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end(pvVar3);
    while (bVar7 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                       *)&oh), bVar7) {
      local_180 = __gnu_cxx::
                  __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                  ::operator*(&__end2);
      _second_trailer_size = QPDFObjectHandle::getObjGen(local_180);
      assignCompressedObjectNumbers(this,_second_trailer_size);
      __gnu_cxx::
      __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
      ::operator++(&__end2);
    }
  }
  peVar12 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  first_half_start = peVar12->next_objid + -1;
  peVar12 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  lindict_id = peVar12->next_objid;
  peVar12 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  first_half_xref = peVar12->next_objid;
  peVar12 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  part4_first_obj = peVar12->next_objid;
  peVar12->next_objid = part4_first_obj + 1;
  local_19c = 0;
  if (bVar6 != 0) {
    peVar12 = std::
              __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    local_19c = peVar12->next_objid;
    peVar12->next_objid = local_19c + 1;
  }
  peVar12 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  local_1a0 = peVar12->next_objid;
  _hint_id = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                       ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                        &part6.
                         super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
  iVar9 = QIntC::to_int<unsigned_long>((unsigned_long *)&hint_id);
  peVar12 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  peVar12->next_objid = iVar9 + peVar12->next_objid;
  peVar12 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  part6_first_obj = peVar12->next_objid;
  peVar12 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  if ((peVar12->encrypted & 1U) != 0) {
    peVar12 = std::
              __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    iVar9 = peVar12->next_objid;
    peVar12->next_objid = iVar9 + 1;
    peVar12 = std::
              __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    peVar12->encryption_dict_objid = iVar9;
  }
  peVar12 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  local_1b0 = peVar12->next_objid;
  peVar12->next_objid = local_1b0 + 1;
  peVar12 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  local_1b4 = peVar12->next_objid;
  sStack_1c0 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                         ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                          &part7.
                           super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
  iVar9 = QIntC::to_int<unsigned_long>(&stack0xfffffffffffffe40);
  peVar12 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  peVar12->next_objid = iVar9 + peVar12->next_objid;
  peVar12 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  vecs1[1]._4_4_ = peVar12->next_objid;
  ppQStack_1d8 = &part6.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
  vecs1[0] = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
             &part7.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  for (__range2_1._4_4_ = 0; __range2_1._4_4_ < 2; __range2_1._4_4_ = __range2_1._4_4_ + 1) {
    pvVar3 = *(vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> **)
              ((long)&stack0xfffffffffffffe28 + (long)__range2_1._4_4_ * 8);
    __end2_1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin(pvVar3);
    oh_1 = (QPDFObjectHandle *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end(pvVar3);
    while (bVar7 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                               *)&oh_1), bVar7) {
      this_04 = __gnu_cxx::
                __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                ::operator*(&__end2_1);
      og = QPDFObjectHandle::getObjGen(this_04);
      assignCompressedObjectNumbers(this,og);
      __gnu_cxx::
      __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
      ::operator++(&__end2_1);
    }
  }
  peVar12 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  last = peVar12->next_objid + -1;
  peVar12 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  iVar9 = peVar12->next_objid;
  pvVar16 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::back
                      ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                       &part6.
                        super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
  iVar10 = QPDFObjectHandle::getObjectID(pvVar16);
  pvVar16 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::back
                      ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                       &part7.
                        super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
  iVar11 = QPDFObjectHandle::getObjectID(pvVar16);
  iVar5 = local_1a0;
  file_size = 0;
  part6_end_offset = 0;
  first_half_max_obj_offset = 0;
  second_xref_offset = 0;
  first_xref_end = 0;
  second_xref_end = 0;
  hint_length = 0;
  peVar12 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  peVar12->next_objid = iVar5;
  enqueuePart(this,(vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                   &part6.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  peVar12 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  iVar5 = local_1b4;
  if (peVar12->next_objid != part6_first_obj) {
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar17,"error encountered after writing part 4 of linearized data");
    __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar12 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  peVar12->next_objid = iVar5;
  enqueuePart(this,(vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                   &part7.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  peVar12 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  if (peVar12->next_objid != vecs1[1]._4_4_) {
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar17,"error encountered after writing part 6 of linearized data");
    __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar12 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  peVar12->next_objid = 1;
  enqueuePart(this,(vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                   &part8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  enqueuePart(this,(vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                   &part9.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  enqueuePart(this,(vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_118);
  peVar12 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  if (peVar12->next_objid == iVar8) {
    hint_buffer.field_2._8_8_ = 0;
    std::__cxx11::string::string((string *)&lin_pass1_file);
    pp_pass1._M_t.
    super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
    ._M_t.
    super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
    .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl =
         (__uniq_ptr_data<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>,_true,_true>
          )(__uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
            )0x0;
    pp_md5._M_t.
    super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
    ._M_t.
    super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
    .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl =
         (__uniq_ptr_data<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>,_true,_true>
          )(__uniq_ptr_data<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>,_true,_true>
            )this;
    std::make_unique<QPDFWriter::PipelinePopper,QPDFWriter*>((QPDFWriter **)&local_288);
    __range1 = (initializer_list<int> *)this;
    std::make_unique<QPDFWriter::PipelinePopper,QPDFWriter*>((QPDFWriter **)&local_298);
    __begin1._0_4_ = 1;
    __begin1._4_4_ = 2;
    local_2b8._M_array = (iterator)&__begin1;
    local_2b8._M_len = 2;
    local_2a8 = &local_2b8;
    __end1 = std::initializer_list<int>::begin(local_2a8);
    piStack_2d0 = std::initializer_list<int>::end(local_2a8);
    do {
      if (__end1 == piStack_2d0) {
        std::
        unique_ptr<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>::
        ~unique_ptr(&local_298);
        std::
        unique_ptr<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>::
        ~unique_ptr(&local_288);
        std::__cxx11::string::~string((string *)&lin_pass1_file);
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_118);
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                   &part9.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                   &part8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                   &part7.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                   &part6.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
                  ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                   &skip_stream_parameters.stream_cache);
        return;
      }
      local_2d4 = *__end1;
      if (local_2d4 == 1) {
        std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)this);
        uVar18 = std::__cxx11::string::empty();
        if ((uVar18 & 1) == 0) {
          std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)this);
          filename = (char *)std::__cxx11::string::c_str();
          pp_pass1._M_t.
          super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
          ._M_t.
          super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
          .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl =
               (__uniq_ptr_data<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>,_true,_true>
                )QUtil::safe_fopen(filename,"wb");
          this_05 = (Pl_StdioFile *)operator_new(0x38);
          Pl_StdioFile::Pl_StdioFile
                    (this_05,"linearization pass1",
                     (FILE *)pp_pass1._M_t.
                             super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
                             .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>.
                             _M_head_impl);
          pushPipeline(this,(Pipeline *)this_05);
          pPVar19 = std::
                    unique_ptr<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                    ::operator*(&local_288);
          std::unique_ptr<qpdf::pl::Link,std::default_delete<qpdf::pl::Link>>::
          unique_ptr<std::default_delete<qpdf::pl::Link>,void>
                    ((unique_ptr<qpdf::pl::Link,std::default_delete<qpdf::pl::Link>> *)&local_2e0,
                     (nullptr_t)0x0);
          activatePipelineStack(this,pPVar19,false,(string *)0x0,&local_2e0);
          std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr
                    (&local_2e0);
        }
        else {
          pPVar19 = std::
                    unique_ptr<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                    ::operator*(&local_288);
          std::unique_ptr<qpdf::pl::Link,std::default_delete<qpdf::pl::Link>>::
          unique_ptr<std::default_delete<qpdf::pl::Link>,void>
                    ((unique_ptr<qpdf::pl::Link,std::default_delete<qpdf::pl::Link>> *)&pos,
                     (nullptr_t)0x0);
          activatePipelineStack
                    (this,pPVar19,true,(string *)0x0,
                     (unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&pos);
          std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr
                    ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&pos);
        }
        peVar12 = std::
                  __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        if ((peVar12->deterministic_id & 1U) != 0) {
          pPVar19 = std::
                    unique_ptr<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                    ::operator*(&local_298);
          pushMD5Pipeline(this,pPVar19);
        }
      }
      writeHeader(this);
      peVar12 = std::
                __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
      local_2f0 = ::qpdf::pl::Count::getCount(peVar12->pipeline);
      openObject(this,part4_first_obj);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&pages,"<<");
      writeString(this,_pages);
      if (local_2d4 == 2) {
        peVar12 = std::
                  __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        pvStack_308 = QPDF::getAllPages(peVar12->pdf);
        peVar12 = std::
                  __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        pvVar20 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                            (pvStack_308,0);
        QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_320,pvVar20);
        pOVar21 = ObjTable<QPDFWriter::Object>::operator[]
                            (&(peVar12->obj).super_ObjTable<QPDFWriter::Object>,
                             (QPDFObjectHandle *)local_320);
        iVar8 = pOVar21->renumber;
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_320);
        local_30c = iVar8;
        local_330 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                              (pvStack_308);
        local_324 = QIntC::to_int<unsigned_long>(&local_330);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_340," /Linearized 1 /L ");
        writeString(this,local_340);
        std::__cxx11::to_string(&local_370,part6_end_offset + hint_buffer.field_2._8_8_);
        sVar28 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_370);
        local_350 = sVar28;
        writeString(this,sVar28);
        std::__cxx11::string::~string((string *)&local_370);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_380," /H [ ");
        writeString(this,local_380);
        peVar12 = std::
                  __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        pNVar22 = ObjTable<QPDFWriter::NewObject>::operator[]
                            (&(peVar12->new_obj).super_ObjTable<QPDFWriter::NewObject>,local_1b0);
        qVar23 = QPDFXRefEntry::getOffset(&pNVar22->xref);
        std::__cxx11::to_string(&local_3b0,qVar23);
        sVar28 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_3b0);
        local_390 = sVar28;
        writeString(this,sVar28);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3c0," ");
        writeString(this,local_3c0);
        std::__cxx11::to_string(&local_3f0,hint_buffer.field_2._8_8_);
        sVar28 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_3f0);
        local_3d0 = sVar28;
        writeString(this,sVar28);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_400," ] /O ");
        writeString(this,local_400);
        std::__cxx11::to_string(&local_430,local_30c);
        sVar28 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_430);
        local_410 = sVar28;
        writeString(this,sVar28);
        std::__cxx11::string::~string((string *)&local_430);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_440," /E ");
        writeString(this,local_440);
        std::__cxx11::to_string(&local_470,first_half_max_obj_offset + hint_buffer.field_2._8_8_);
        sVar28 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_470);
        local_450 = sVar28;
        writeString(this,sVar28);
        std::__cxx11::string::~string((string *)&local_470);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_480," /N ");
        writeString(this,local_480);
        std::__cxx11::to_string(&local_4b0,local_324);
        sVar28 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_4b0);
        local_490 = sVar28;
        writeString(this,sVar28);
        std::__cxx11::string::~string((string *)&local_4b0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_4c0," /T ");
        writeString(this,local_4c0);
        std::__cxx11::to_string(&local_4f0,file_size + hint_buffer.field_2._8_8_);
        sVar28 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_4f0);
        local_4d0 = sVar28;
        writeString(this,sVar28);
        std::__cxx11::string::~string((string *)&local_4f0);
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_500," >>");
      writeString(this,local_500);
      closeObject(this,part4_first_obj);
      qVar23 = local_2f0;
      peVar12 = std::
                __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
      qVar24 = ::qpdf::pl::Count::getCount(peVar12->pipeline);
      local_508 = (qVar23 - qVar24) + 200;
      sVar25 = QIntC::to_size<long_long>(&local_508);
      writePad(this,sVar25);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_518,"\n");
      writeString(this,local_518);
      peVar12 = std::
                __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
      sVar28 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)&peVar12->extra_header_text);
      local_520 = sVar28._M_str;
      first_xref_offset = sVar28._M_len;
      writeString(this,sVar28);
      peVar12 = std::
                __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
      hint_offset = ::qpdf::pl::Count::getCount(peVar12->pipeline);
      endpos = 0;
      if (local_2d4 == 2) {
        peVar12 = std::
                  __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        pNVar22 = ObjTable<QPDFWriter::NewObject>::operator[]
                            (&(peVar12->new_obj).super_ObjTable<QPDFWriter::NewObject>,local_1b0);
        endpos = QPDFXRefEntry::getOffset(&pNVar22->xref);
      }
      if (bVar6 == 0) {
        writeXRefTable(this,t_lin_first,first_half_xref,last,iVar9,
                       hint_buffer.field_2._8_8_ + first_xref_end,local_2d4 == 1,local_1b0,endpos,
                       hint_buffer.field_2._8_8_,local_2d4);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&__range2_2,
                   "startxref\n0\n%%EOF\n");
        writeString(this,___range2_2);
      }
      else {
        if (local_2d4 == 1) {
          second_xref_offset = 0x2000000;
        }
        peVar12 = std::
                  __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        local_2f0 = ::qpdf::pl::Count::getCount(peVar12->pipeline);
        writeXRefStream(this,local_19c,last,second_xref_offset,t_lin_first,first_half_xref,last,
                        iVar9,hint_buffer.field_2._8_8_ + first_xref_end,local_1b0,endpos,
                        hint_buffer.field_2._8_8_,local_2d4 == 1,local_2d4);
        peVar12 = std::
                  __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        local_540 = ::qpdf::pl::Count::getCount(peVar12->pipeline);
        if (local_2d4 == 1) {
          sVar25 = calculateXrefStreamPadding(this,local_540 - local_2f0);
          writePad(this,sVar25);
          peVar12 = std::
                    __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)this);
          second_xref_end = ::qpdf::pl::Count::getCount(peVar12->pipeline);
        }
        else {
          local_548 = second_xref_end - local_540;
          sVar25 = QIntC::to_size<long_long>(&local_548);
          writePad(this,sVar25);
          peVar12 = std::
                    __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)this);
          qVar23 = ::qpdf::pl::Count::getCount(peVar12->pipeline);
          if (qVar23 != second_xref_end) {
            local_5e9 = 1;
            plVar26 = (logic_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::to_string(&local_5c8,second_xref_end);
            std::operator+(&local_5a8,
                           "insufficient padding for first pass xref stream; first_xref_end=",
                           &local_5c8);
            std::operator+(&local_588,&local_5a8,"; endpos=");
            std::__cxx11::to_string(&local_5e8,local_540);
            std::operator+(&local_568,&local_588,&local_5e8);
            std::logic_error::logic_error(plVar26,(string *)&local_568);
            local_5e9 = 0;
            __cxa_throw(plVar26,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
        }
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_600,"\n");
        writeString(this,local_600);
      }
      peVar12 = std::
                __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
      __end2_2 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin
                           (&peVar12->object_queue);
      cur_object = (QPDFObjectHandle *)
                   std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end
                             (&peVar12->object_queue);
      while( true ) {
        bVar7 = __gnu_cxx::operator!=
                          (&__end2_2,
                           (__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                            *)&cur_object);
        if (!bVar7) break;
        local_630 = __gnu_cxx::
                    __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                    ::operator*(&__end2_2);
        iVar8 = QPDFObjectHandle::getObjectID(local_630);
        if (iVar8 == iVar11) {
          peVar12 = std::
                    __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)this);
          second_xref_offset = ::qpdf::pl::Count::getCount(peVar12->pipeline);
        }
        QPDFObjectHandle::QPDFObjectHandle(&local_640,local_630);
        writeObject(this,&local_640,-1);
        QPDFObjectHandle::~QPDFObjectHandle(&local_640);
        iVar8 = QPDFObjectHandle::getObjectID(local_630);
        if (iVar8 == iVar10) {
          peVar12 = std::
                    __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)this);
          if ((peVar12->encrypted & 1U) != 0) {
            writeEncryptionDictionary(this);
          }
          if (local_2d4 == 1) {
            peVar12 = std::
                      __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)this);
            qVar23 = ::qpdf::pl::Count::getCount(peVar12->pipeline);
            QPDFXRefEntry::QPDFXRefEntry(&local_658,qVar23);
            peVar12 = std::
                      __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)this);
            pNVar22 = ObjTable<QPDFWriter::NewObject>::operator[]
                                (&(peVar12->new_obj).super_ObjTable<QPDFWriter::NewObject>,local_1b0
                                );
            (pNVar22->xref).type = local_658.type;
            *(undefined4 *)&(pNVar22->xref).field_0x4 = local_658._4_4_;
            (pNVar22->xref).field1 = local_658.field1;
            (pNVar22->xref).field2 = local_658.field2;
          }
          else {
            sVar28 = (string_view)
                     std::__cxx11::string::operator_cast_to_basic_string_view
                               ((string *)&lin_pass1_file);
            local_660 = sVar28._M_str;
            endpos_1 = sVar28._M_len;
            writeString(this,sVar28);
          }
        }
        iVar8 = QPDFObjectHandle::getObjectID(local_630);
        if (iVar8 == iVar11) {
          peVar12 = std::
                    __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)this);
          first_half_max_obj_offset = ::qpdf::pl::Count::getCount(peVar12->pipeline);
        }
        __gnu_cxx::
        __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
        ::operator++(&__end2_2);
      }
      peVar12 = std::
                __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
      first_xref_end = ::qpdf::pl::Count::getCount(peVar12->pipeline);
      if (bVar6 == 0) {
        file_size = writeXRefTable(this,t_lin_second,0,first_half_start,lindict_id,0,false,0,0,0,
                                   local_2d4);
      }
      else {
        peVar12 = std::
                  __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        local_2f0 = ::qpdf::pl::Count::getCount(peVar12->pipeline);
        file_size = writeXRefStream(this,local_134,first_half_start,first_xref_end,t_lin_second,0,
                                    first_half_start,lindict_id,0,0,0,0,local_2d4 == 1,local_2d4);
        peVar12 = std::
                  __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        local_670 = ::qpdf::pl::Count::getCount(peVar12->pipeline);
        if (local_2d4 == 1) {
          sVar25 = calculateXrefStreamPadding(this,local_670 - local_2f0);
          writePad(this,sVar25);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_680,"\n");
          writeString(this,local_680);
          peVar12 = std::
                    __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)this);
          hint_length = ::qpdf::pl::Count::getCount(peVar12->pipeline);
        }
        else {
          lVar1 = hint_length + -1 + hint_buffer.field_2._8_8_;
          peVar12 = std::
                    __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)this);
          qVar23 = ::qpdf::pl::Count::getCount(peVar12->pipeline);
          local_688 = lVar1 - qVar23;
          sVar25 = QIntC::to_size<long_long>(&local_688);
          writePad(this,sVar25);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_698,"\n");
          writeString(this,local_698);
          peVar12 = std::
                    __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)this);
          qVar23 = ::qpdf::pl::Count::getCount(peVar12->pipeline);
          if (qVar23 != hint_length + hint_buffer.field_2._8_8_) {
            plVar26 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error
                      (plVar26,"count mismatch after xref stream; possible insufficient padding?");
            __cxa_throw(plVar26,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
        }
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_6a8,"startxref\n");
      writeString(this,local_6a8);
      std::__cxx11::to_string(&local_6d8,hint_offset);
      sVar28 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_6d8);
      local_6b8 = sVar28;
      writeString(this,sVar28);
      std::__cxx11::string::~string((string *)&local_6d8);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&hint_offset1,"\n%%EOF\n");
      writeString(this,_hint_offset1);
      if (local_2d4 == 1) {
        peVar12 = std::
                  __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        if ((peVar12->deterministic_id & 1U) != 0) {
          QTC::TC("qpdf","QPDFWriter linearized deterministic ID",(byte)~bVar6 & 1);
          computeDeterministicIDData(this);
          std::
          unique_ptr<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>::
          operator=(&local_298,(nullptr_t)0x0);
          peVar12 = std::
                    __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)this);
          if (peVar12->md5_pipeline != (Pl_MD5 *)0x0) {
            __assert_fail("m->md5_pipeline == nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFWriter.cc"
                          ,0xb57,"void QPDFWriter::writeLinearized()");
          }
        }
        peVar12 = std::
                  __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        part6_end_offset = ::qpdf::pl::Count::getCount(peVar12->pipeline);
        std::
        unique_ptr<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>::
        operator=(&local_288,(nullptr_t)0x0);
        peVar12 = std::
                  __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        pNVar22 = ObjTable<QPDFWriter::NewObject>::operator[]
                            (&(peVar12->new_obj).super_ObjTable<QPDFWriter::NewObject>,local_1b0);
        pp_hint.stack_id = QPDFXRefEntry::getOffset(&pNVar22->xref);
        PipelinePopper::PipelinePopper((PipelinePopper *)local_700,this);
        activatePipelineStack(this,(PipelinePopper *)local_700,(string *)&lin_pass1_file);
        writeHintStream(this,local_1b0);
        PipelinePopper::~PipelinePopper((PipelinePopper *)local_700);
        local_708 = std::__cxx11::string::size();
        hint_buffer.field_2._8_8_ = QIntC::to_offset<unsigned_long>(&local_708);
        QPDFXRefEntry::QPDFXRefEntry(&local_720,pp_hint.stack_id);
        peVar12 = std::
                  __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        pNVar22 = ObjTable<QPDFWriter::NewObject>::operator[]
                            (&(peVar12->new_obj).super_ObjTable<QPDFWriter::NewObject>,local_1b0);
        _Var4 = pp_pass1;
        (pNVar22->xref).type = local_720.type;
        *(undefined4 *)&(pNVar22->xref).field_0x4 = local_720._4_4_;
        (pNVar22->xref).field1 = local_720.field1;
        (pNVar22->xref).field2 = local_720.field2;
        if ((__uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
             )pp_pass1._M_t.
              super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
              ._M_t.
              super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
              .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
             )0x0) {
          std::__cxx11::to_string(&local_740,pp_hint.stack_id);
          uVar27 = std::__cxx11::string::c_str();
          fprintf((FILE *)_Var4._M_t.
                          super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
                          .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl,
                  "%% hint_offset=%s\n",uVar27);
          std::__cxx11::string::~string((string *)&local_740);
          _Var4 = pp_pass1;
          std::__cxx11::to_string(&local_760,hint_buffer.field_2._8_8_);
          uVar27 = std::__cxx11::string::c_str();
          fprintf((FILE *)_Var4._M_t.
                          super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
                          .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl,
                  "%% hint_length=%s\n",uVar27);
          std::__cxx11::string::~string((string *)&local_760);
          _Var4 = pp_pass1;
          std::__cxx11::to_string(&local_780,first_xref_end);
          uVar27 = std::__cxx11::string::c_str();
          fprintf((FILE *)_Var4._M_t.
                          super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
                          .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl,
                  "%% second_xref_offset=%s\n",uVar27);
          std::__cxx11::string::~string((string *)&local_780);
          _Var4 = pp_pass1;
          std::__cxx11::to_string(&local_7a0,hint_length);
          uVar27 = std::__cxx11::string::c_str();
          fprintf((FILE *)_Var4._M_t.
                          super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
                          .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl,
                  "%% second_xref_end=%s\n",uVar27);
          std::__cxx11::string::~string((string *)&local_7a0);
          fclose((FILE *)pp_pass1._M_t.
                         super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
                         .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl);
          pp_pass1._M_t.
          super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
          ._M_t.
          super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
          .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl =
               (__uniq_ptr_data<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>,_true,_true>
                )(__uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                  )0x0;
        }
      }
      __end1 = __end1 + 1;
    } while( true );
  }
  prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (prVar17,"error encountered after writing part 9 of linearized data");
  __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
QPDFWriter::writeLinearized()
{
    // Optimize file and enqueue objects in order

    std::map<int, int> stream_cache;

    auto skip_stream_parameters = [this, &stream_cache](QPDFObjectHandle& stream) {
        auto& result = stream_cache[stream.getObjectID()];
        if (result == 0) {
            bool compress_stream;
            bool is_metadata;
            if (willFilterStream(stream, compress_stream, is_metadata, nullptr)) {
                result = 2;
            } else {
                result = 1;
            }
        }
        return result;
    };

    QPDF::Writer::optimize(m->pdf, m->obj, skip_stream_parameters);

    std::vector<QPDFObjectHandle> part4;
    std::vector<QPDFObjectHandle> part6;
    std::vector<QPDFObjectHandle> part7;
    std::vector<QPDFObjectHandle> part8;
    std::vector<QPDFObjectHandle> part9;
    QPDF::Writer::getLinearizedParts(m->pdf, m->obj, part4, part6, part7, part8, part9);

    // Object number sequence:
    //
    //  second half
    //    second half uncompressed objects
    //    second half xref stream, if any
    //    second half compressed objects
    //  first half
    //    linearization dictionary
    //    first half xref stream, if any
    //    part 4 uncompresesd objects
    //    encryption dictionary, if any
    //    hint stream
    //    part 6 uncompressed objects
    //    first half compressed objects
    //

    // Second half objects
    int second_half_uncompressed = QIntC::to_int(part7.size() + part8.size() + part9.size());
    int second_half_first_obj = 1;
    int after_second_half = 1 + second_half_uncompressed;
    m->next_objid = after_second_half;
    int second_half_xref = 0;
    bool need_xref_stream = !m->obj.streams_empty;
    if (need_xref_stream) {
        second_half_xref = m->next_objid++;
    }
    // Assign numbers to all compressed objects in the second half.
    std::vector<QPDFObjectHandle>* vecs2[] = {&part7, &part8, &part9};
    for (int i = 0; i < 3; ++i) {
        for (auto const& oh: *vecs2[i]) {
            assignCompressedObjectNumbers(oh.getObjGen());
        }
    }
    int second_half_end = m->next_objid - 1;
    int second_trailer_size = m->next_objid;

    // First half objects
    int first_half_start = m->next_objid;
    int lindict_id = m->next_objid++;
    int first_half_xref = 0;
    if (need_xref_stream) {
        first_half_xref = m->next_objid++;
    }
    int part4_first_obj = m->next_objid;
    m->next_objid += QIntC::to_int(part4.size());
    int after_part4 = m->next_objid;
    if (m->encrypted) {
        m->encryption_dict_objid = m->next_objid++;
    }
    int hint_id = m->next_objid++;
    int part6_first_obj = m->next_objid;
    m->next_objid += QIntC::to_int(part6.size());
    int after_part6 = m->next_objid;
    // Assign numbers to all compressed objects in the first half
    std::vector<QPDFObjectHandle>* vecs1[] = {&part4, &part6};
    for (int i = 0; i < 2; ++i) {
        for (auto const& oh: *vecs1[i]) {
            assignCompressedObjectNumbers(oh.getObjGen());
        }
    }
    int first_half_end = m->next_objid - 1;
    int first_trailer_size = m->next_objid;

    int part4_end_marker = part4.back().getObjectID();
    int part6_end_marker = part6.back().getObjectID();
    qpdf_offset_t space_before_zero = 0;
    qpdf_offset_t file_size = 0;
    qpdf_offset_t part6_end_offset = 0;
    qpdf_offset_t first_half_max_obj_offset = 0;
    qpdf_offset_t second_xref_offset = 0;
    qpdf_offset_t first_xref_end = 0;
    qpdf_offset_t second_xref_end = 0;

    m->next_objid = part4_first_obj;
    enqueuePart(part4);
    if (m->next_objid != after_part4) {
        // This can happen with very botched files as in the fuzzer test. There are likely some
        // faulty assumptions in calculateLinearizationData
        throw std::runtime_error("error encountered after writing part 4 of linearized data");
    }
    m->next_objid = part6_first_obj;
    enqueuePart(part6);
    if (m->next_objid != after_part6) {
        throw std::runtime_error("error encountered after writing part 6 of linearized data");
    }
    m->next_objid = second_half_first_obj;
    enqueuePart(part7);
    enqueuePart(part8);
    enqueuePart(part9);
    if (m->next_objid != after_second_half) {
        throw std::runtime_error("error encountered after writing part 9 of linearized data");
    }

    qpdf_offset_t hint_length = 0;
    std::string hint_buffer;

    // Write file in two passes.  Part numbers refer to PDF spec 1.4.

    FILE* lin_pass1_file = nullptr;
    auto pp_pass1 = std::make_unique<PipelinePopper>(this);
    auto pp_md5 = std::make_unique<PipelinePopper>(this);
    for (int pass: {1, 2}) {
        if (pass == 1) {
            if (!m->lin_pass1_filename.empty()) {
                lin_pass1_file = QUtil::safe_fopen(m->lin_pass1_filename.c_str(), "wb");
                pushPipeline(new Pl_StdioFile("linearization pass1", lin_pass1_file));
                activatePipelineStack(*pp_pass1);
            } else {
                activatePipelineStack(*pp_pass1, true);
            }
            if (m->deterministic_id) {
                pushMD5Pipeline(*pp_md5);
            }
        }

        // Part 1: header

        writeHeader();

        // Part 2: linearization parameter dictionary.  Save enough space to write real dictionary.
        // 200 characters is enough space if all numerical values in the parameter dictionary that
        // contain offsets are 20 digits long plus a few extra characters for safety.  The entire
        // linearization parameter dictionary must appear within the first 1024 characters of the
        // file.

        qpdf_offset_t pos = m->pipeline->getCount();
        openObject(lindict_id);
        writeString("<<");
        if (pass == 2) {
            std::vector<QPDFObjectHandle> const& pages = m->pdf.getAllPages();
            int first_page_object = m->obj[pages.at(0)].renumber;
            int npages = QIntC::to_int(pages.size());

            writeString(" /Linearized 1 /L ");
            writeString(std::to_string(file_size + hint_length));
            // Implementation note 121 states that a space is mandatory after this open bracket.
            writeString(" /H [ ");
            writeString(std::to_string(m->new_obj[hint_id].xref.getOffset()));
            writeString(" ");
            writeString(std::to_string(hint_length));
            writeString(" ] /O ");
            writeString(std::to_string(first_page_object));
            writeString(" /E ");
            writeString(std::to_string(part6_end_offset + hint_length));
            writeString(" /N ");
            writeString(std::to_string(npages));
            writeString(" /T ");
            writeString(std::to_string(space_before_zero + hint_length));
        }
        writeString(" >>");
        closeObject(lindict_id);
        static int const pad = 200;
        writePad(QIntC::to_size(pos - m->pipeline->getCount() + pad));
        writeString("\n");

        // If the user supplied any additional header text, write it here after the linearization
        // parameter dictionary.
        writeString(m->extra_header_text);

        // Part 3: first page cross reference table and trailer.

        qpdf_offset_t first_xref_offset = m->pipeline->getCount();
        qpdf_offset_t hint_offset = 0;
        if (pass == 2) {
            hint_offset = m->new_obj[hint_id].xref.getOffset();
        }
        if (need_xref_stream) {
            // Must pad here too.
            if (pass == 1) {
                // Set first_half_max_obj_offset to a value large enough to force four bytes to be
                // reserved for each file offset.  This would provide adequate space for the xref
                // stream as long as the last object in page 1 starts with in the first 4 GB of the
                // file, which is extremely likely.  In the second pass, we will know the actual
                // value for this, but it's okay if it's smaller.
                first_half_max_obj_offset = 1 << 25;
            }
            pos = m->pipeline->getCount();
            writeXRefStream(
                first_half_xref,
                first_half_end,
                first_half_max_obj_offset,
                t_lin_first,
                first_half_start,
                first_half_end,
                first_trailer_size,
                hint_length + second_xref_offset,
                hint_id,
                hint_offset,
                hint_length,
                (pass == 1),
                pass);
            qpdf_offset_t endpos = m->pipeline->getCount();
            if (pass == 1) {
                // Pad so we have enough room for the real xref stream.
                writePad(calculateXrefStreamPadding(endpos - pos));
                first_xref_end = m->pipeline->getCount();
            } else {
                // Pad so that the next object starts at the same place as in pass 1.
                writePad(QIntC::to_size(first_xref_end - endpos));

                if (m->pipeline->getCount() != first_xref_end) {
                    throw std::logic_error(
                        "insufficient padding for first pass xref stream; "
                        "first_xref_end=" +
                        std::to_string(first_xref_end) + "; endpos=" + std::to_string(endpos));
                }
            }
            writeString("\n");
        } else {
            writeXRefTable(
                t_lin_first,
                first_half_start,
                first_half_end,
                first_trailer_size,
                hint_length + second_xref_offset,
                (pass == 1),
                hint_id,
                hint_offset,
                hint_length,
                pass);
            writeString("startxref\n0\n%%EOF\n");
        }

        // Parts 4 through 9

        for (auto const& cur_object: m->object_queue) {
            if (cur_object.getObjectID() == part6_end_marker) {
                first_half_max_obj_offset = m->pipeline->getCount();
            }
            writeObject(cur_object);
            if (cur_object.getObjectID() == part4_end_marker) {
                if (m->encrypted) {
                    writeEncryptionDictionary();
                }
                if (pass == 1) {
                    m->new_obj[hint_id].xref = QPDFXRefEntry(m->pipeline->getCount());
                } else {
                    // Part 5: hint stream
                    writeString(hint_buffer);
                }
            }
            if (cur_object.getObjectID() == part6_end_marker) {
                part6_end_offset = m->pipeline->getCount();
            }
        }

        // Part 10: overflow hint stream -- not used

        // Part 11: main cross reference table and trailer

        second_xref_offset = m->pipeline->getCount();
        if (need_xref_stream) {
            pos = m->pipeline->getCount();
            space_before_zero = writeXRefStream(
                second_half_xref,
                second_half_end,
                second_xref_offset,
                t_lin_second,
                0,
                second_half_end,
                second_trailer_size,
                0,
                0,
                0,
                0,
                (pass == 1),
                pass);
            qpdf_offset_t endpos = m->pipeline->getCount();

            if (pass == 1) {
                // Pad so we have enough room for the real xref stream.  See comments for previous
                // xref stream on how we calculate the padding.
                writePad(calculateXrefStreamPadding(endpos - pos));
                writeString("\n");
                second_xref_end = m->pipeline->getCount();
            } else {
                // Make the file size the same.
                writePad(
                    QIntC::to_size(second_xref_end + hint_length - 1 - m->pipeline->getCount()));
                writeString("\n");

                // If this assertion fails, maybe we didn't have enough padding above.
                if (m->pipeline->getCount() != second_xref_end + hint_length) {
                    throw std::logic_error(
                        "count mismatch after xref stream; possible insufficient padding?");
                }
            }
        } else {
            space_before_zero = writeXRefTable(
                t_lin_second, 0, second_half_end, second_trailer_size, 0, false, 0, 0, 0, pass);
        }
        writeString("startxref\n");
        writeString(std::to_string(first_xref_offset));
        writeString("\n%%EOF\n");

        if (pass == 1) {
            if (m->deterministic_id) {
                QTC::TC("qpdf", "QPDFWriter linearized deterministic ID", need_xref_stream ? 0 : 1);
                computeDeterministicIDData();
                pp_md5 = nullptr;
                qpdf_assert_debug(m->md5_pipeline == nullptr);
            }

            // Close first pass pipeline
            file_size = m->pipeline->getCount();
            pp_pass1 = nullptr;

            // Save hint offset since it will be set to zero by calling openObject.
            qpdf_offset_t hint_offset1 = m->new_obj[hint_id].xref.getOffset();

            // Write hint stream to a buffer
            {
                PipelinePopper pp_hint(this);
                activatePipelineStack(pp_hint, hint_buffer);
                writeHintStream(hint_id);
            }
            hint_length = QIntC::to_offset(hint_buffer.size());

            // Restore hint offset
            m->new_obj[hint_id].xref = QPDFXRefEntry(hint_offset1);
            if (lin_pass1_file) {
                // Write some debugging information
                fprintf(
                    lin_pass1_file, "%% hint_offset=%s\n", std::to_string(hint_offset1).c_str());
                fprintf(lin_pass1_file, "%% hint_length=%s\n", std::to_string(hint_length).c_str());
                fprintf(
                    lin_pass1_file,
                    "%% second_xref_offset=%s\n",
                    std::to_string(second_xref_offset).c_str());
                fprintf(
                    lin_pass1_file,
                    "%% second_xref_end=%s\n",
                    std::to_string(second_xref_end).c_str());
                fclose(lin_pass1_file);
                lin_pass1_file = nullptr;
            }
        }
    }
}